

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O3

void Omega_h::add_transition(FiniteAutomaton *fa,int from_state,int at_symbol,int to_state)

{
  int iVar1;
  Ref pvVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  if (to_state < 0) {
    pcVar4 = "0 <= to_state";
    uVar3 = 0x34;
  }
  else {
    iVar1 = get_nrows<int>(&fa->table);
    if (to_state < iVar1) {
      if (at_symbol < 0) {
        pcVar4 = "0 <= at_symbol";
        uVar3 = 0x36;
      }
      else if (at_symbol < (fa->table).ncols) {
        pvVar2 = at<int>(&fa->table,from_state,at_symbol);
        if (*pvVar2 == -1) {
          pvVar2 = at<int>(&fa->table,from_state,at_symbol);
          *pvVar2 = to_state;
          return;
        }
        pcVar4 = "at(fa.table, from_state, at_symbol) == -1";
        uVar3 = 0x39;
      }
      else {
        pcVar4 = "at_symbol < get_ncols(fa.table)";
        uVar3 = 0x38;
      }
    }
    else {
      pcVar4 = "to_state < get_nstates(fa)";
      uVar3 = 0x35;
    }
  }
  fail("assertion %s failed at %s +%d\n",pcVar4,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
       ,uVar3);
}

Assistant:

void add_transition(
    FiniteAutomaton& fa, int from_state, int at_symbol, int to_state) {
  OMEGA_H_CHECK(0 <= to_state);
  OMEGA_H_CHECK(to_state < get_nstates(fa));
  OMEGA_H_CHECK(0 <= at_symbol);
  OMEGA_H_CHECK(
      at_symbol < get_ncols(fa.table));  // allow setting epsilon transitions
  OMEGA_H_CHECK(at(fa.table, from_state, at_symbol) == -1);
  at(fa.table, from_state, at_symbol) = to_state;
}